

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  byte bVar9;
  int iVar10;
  timediff_t tVar11;
  curltime cVar12;
  curltime older;
  curltime newer;
  curltime newer_00;
  undefined4 uStack_44;
  undefined1 local_40 [8];
  curltime now;
  timediff_t timeout_ms;
  int timeout_set;
  _Bool duringconnect_local;
  curltime *nowp_local;
  Curl_easy *data_local;
  
  iVar10 = 0;
  if (duringconnect) {
    iVar10 = 300000;
  }
  now._8_8_ = SEXT48(iVar10);
  bVar9 = 0 < (data->set).timeout;
  if ((duringconnect) && (0 < (data->set).connecttimeout)) {
    bVar9 = bVar9 | 2;
  }
  if (bVar9 == 1) {
    now._8_8_ = (data->set).timeout;
  }
  else if (bVar9 == 2) {
    now._8_8_ = (data->set).connecttimeout;
  }
  else if (bVar9 == 3) {
    if ((data->set).timeout < (data->set).connecttimeout) {
      now._8_8_ = (data->set).timeout;
    }
    else {
      now._8_8_ = (data->set).connecttimeout;
    }
  }
  else if (!duringconnect) {
    return 0;
  }
  _timeout_set = nowp;
  if (nowp == (curltime *)0x0) {
    cVar12 = Curl_now();
    local_40 = (undefined1  [8])cVar12.tv_sec;
    now.tv_sec = CONCAT44(uStack_44,cVar12.tv_usec);
    _timeout_set = (curltime *)local_40;
  }
  if (duringconnect) {
    uVar3 = _timeout_set->tv_sec;
    uVar4 = _timeout_set->tv_usec;
    newer.tv_usec = uVar4;
    newer.tv_sec = uVar3;
    uVar1 = (data->progress).t_startsingle.tv_sec;
    uVar2 = (data->progress).t_startsingle.tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    older._12_4_ = 0;
    newer._12_4_ = 0;
    tVar11 = Curl_timediff(newer,older);
    now._8_8_ = now._8_8_ - tVar11;
  }
  else {
    uVar7 = _timeout_set->tv_sec;
    uVar8 = _timeout_set->tv_usec;
    newer_00.tv_usec = uVar8;
    newer_00.tv_sec = uVar7;
    uVar5 = (data->progress).t_startop.tv_sec;
    uVar6 = (data->progress).t_startop.tv_usec;
    cVar12.tv_usec = uVar6;
    cVar12.tv_sec = uVar5;
    cVar12._12_4_ = 0;
    newer_00._12_4_ = 0;
    tVar11 = Curl_timediff(newer_00,cVar12);
    now._8_8_ = now._8_8_ - tVar11;
  }
  if (now._8_8_ == 0) {
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else {
    data_local = (Curl_easy *)now._8_8_;
  }
  return (timediff_t)data_local;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  int timeout_set = 0;
  timediff_t timeout_ms = duringconnect?DEFAULT_CONNECT_TIMEOUT:0;
  struct curltime now;

  /* if a timeout is set, use the most restrictive one */

  if(data->set.timeout > 0)
    timeout_set |= 1;
  if(duringconnect && (data->set.connecttimeout > 0))
    timeout_set |= 2;

  switch(timeout_set) {
  case 1:
    timeout_ms = data->set.timeout;
    break;
  case 2:
    timeout_ms = data->set.connecttimeout;
    break;
  case 3:
    if(data->set.timeout < data->set.connecttimeout)
      timeout_ms = data->set.timeout;
    else
      timeout_ms = data->set.connecttimeout;
    break;
  default:
    /* use the default */
    if(!duringconnect)
      /* if we're not during connect, there's no default timeout so if we're
         at zero we better just return zero and not make it a negative number
         by the math below */
      return 0;
    break;
  }

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  /* subtract elapsed time */
  if(duringconnect)
    /* since this most recent connect started */
    timeout_ms -= Curl_timediff(*nowp, data->progress.t_startsingle);
  else
    /* since the entire operation started */
    timeout_ms -= Curl_timediff(*nowp, data->progress.t_startop);
  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}